

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlCtxtVErr(xmlParserCtxtPtr ctxt,xmlNodePtr node,xmlErrorDomain domain,xmlParserErrors code,
                xmlErrorLevel level,xmlChar *str1,xmlChar *str2,xmlChar *str3,int int1,char *msg,
                __va_list_tag *ap)

{
  int iVar1;
  xmlParserInputPtr local_90;
  xmlParserInputPtr input;
  int local_80;
  int res;
  int col;
  int line;
  char *file;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  xmlChar *str1_local;
  xmlErrorLevel level_local;
  xmlParserErrors code_local;
  xmlErrorDomain domain_local;
  xmlNodePtr node_local;
  xmlParserCtxtPtr ctxt_local;
  
  channel = (xmlGenericErrorFunc)0x0;
  data = (void *)0x0;
  file = (char *)0x0;
  _col = (char *)0x0;
  res = 0;
  local_80 = 0;
  if (code == XML_ERR_NO_MEMORY) {
    xmlCtxtErrMemory(ctxt);
  }
  else if (ctxt == (xmlParserCtxtPtr)0x0) {
    iVar1 = xmlVRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                           (void *)0x0,node,domain,code,level,(char *)0x0,0,(char *)str1,
                           (char *)str2,(char *)str3,int1,0,msg,ap);
    if (iVar1 < 0) {
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,1,
                          (xmlError *)0x0);
    }
  }
  else if ((ctxt->disableSAX < 2) && (iVar1 = xmlCtxtIsCatastrophicError(ctxt), iVar1 == 0)) {
    if (level == XML_ERR_WARNING) {
      if (99 < ctxt->nbWarnings) {
        return;
      }
      ctxt->nbWarnings = ctxt->nbWarnings + 1;
    }
    else {
      if ((99 < ctxt->nbErrors) &&
         (((level < XML_ERR_FATAL || (ctxt->wellFormed == 0)) &&
          (iVar1 = xmlIsCatastrophicError(level,code), iVar1 == 0)))) {
        return;
      }
      ctxt->nbErrors = ctxt->nbErrors + 1;
    }
    if (((ctxt->options & 0x20U) == 0) &&
       ((level != XML_ERR_WARNING || ((ctxt->options & 0x40U) == 0)))) {
      if (ctxt->errorHandler == (xmlStructuredErrorFunc)0x0) {
        if ((ctxt->sax->initialized == 0xdeedbeaf) &&
           (ctxt->sax->serror != (xmlStructuredErrorFunc)0x0)) {
          channel = (xmlGenericErrorFunc)ctxt->sax->serror;
          file = (char *)ctxt->userData;
        }
        else if ((domain == XML_FROM_VALID) || (domain == XML_FROM_DTD)) {
          if (level == XML_ERR_WARNING) {
            data = (ctxt->vctxt).warning;
          }
          else {
            data = (ctxt->vctxt).error;
          }
          file = (char *)(ctxt->vctxt).userData;
        }
        else {
          if (level == XML_ERR_WARNING) {
            data = ctxt->sax->warning;
          }
          else {
            data = ctxt->sax->error;
          }
          file = (char *)ctxt->userData;
        }
      }
      else {
        channel = (xmlGenericErrorFunc)ctxt->errorHandler;
        file = (char *)ctxt->errorCtxt;
      }
    }
    if (ctxt->input != (xmlParserInputPtr)0x0) {
      local_90 = ctxt->input;
      if ((local_90->filename == (char *)0x0) && (1 < ctxt->inputNr)) {
        local_90 = ctxt->inputTab[ctxt->inputNr + -2];
      }
      _col = local_90->filename;
      res = local_90->line;
      local_80 = local_90->col;
    }
    iVar1 = xmlVRaiseError((xmlStructuredErrorFunc)channel,(xmlGenericErrorFunc)data,file,ctxt,node,
                           domain,code,level,_col,res,(char *)str1,(char *)str2,(char *)str3,int1,
                           local_80,msg,ap);
    if (iVar1 < 0) {
      xmlCtxtErrMemory(ctxt);
    }
    else {
      if (XML_ERR_WARNING < level) {
        ctxt->errNo = code;
      }
      if (level == XML_ERR_FATAL) {
        ctxt->wellFormed = 0;
        iVar1 = xmlCtxtIsCatastrophicError(ctxt);
        if (iVar1 == 0) {
          if (ctxt->recovery == 0) {
            ctxt->disableSAX = 1;
          }
        }
        else {
          ctxt->disableSAX = 2;
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlCtxtVErr(xmlParserCtxtPtr ctxt, xmlNodePtr node, xmlErrorDomain domain,
            xmlParserErrors code, xmlErrorLevel level,
            const xmlChar *str1, const xmlChar *str2, const xmlChar *str3,
            int int1, const char *msg, va_list ap)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;
    const char *file = NULL;
    int line = 0;
    int col = 0;
    int res;

    if (code == XML_ERR_NO_MEMORY) {
        xmlCtxtErrMemory(ctxt);
        return;
    }

    if (ctxt == NULL) {
        res = xmlVRaiseError(NULL, NULL, NULL, NULL, node, domain, code,
                             level, NULL, 0, (const char *) str1,
                             (const char *) str2, (const char *) str3,
                             int1, 0, msg, ap);
        if (res < 0)
            xmlRaiseMemoryError(NULL, NULL, NULL, XML_FROM_PARSER, NULL);

        return;
    }

    if (PARSER_STOPPED(ctxt))
	return;

    /* Don't overwrite catastrophic errors */
    if (xmlCtxtIsCatastrophicError(ctxt))
        return;

    if (level == XML_ERR_WARNING) {
        if (ctxt->nbWarnings >= XML_MAX_ERRORS)
            return;
        ctxt->nbWarnings += 1;
    } else {
        /* Report at least one fatal error. */
        if ((ctxt->nbErrors >= XML_MAX_ERRORS) &&
            ((level < XML_ERR_FATAL) || (ctxt->wellFormed == 0)) &&
            (!xmlIsCatastrophicError(level, code)))
            return;
        ctxt->nbErrors += 1;
    }

    if (((ctxt->options & XML_PARSE_NOERROR) == 0) &&
        ((level != XML_ERR_WARNING) ||
         ((ctxt->options & XML_PARSE_NOWARNING) == 0))) {
        if (ctxt->errorHandler) {
            schannel = ctxt->errorHandler;
            data = ctxt->errorCtxt;
        } else if ((ctxt->sax->initialized == XML_SAX2_MAGIC) &&
            (ctxt->sax->serror != NULL)) {
            schannel = ctxt->sax->serror;
            data = ctxt->userData;
        } else if ((domain == XML_FROM_VALID) || (domain == XML_FROM_DTD)) {
            if (level == XML_ERR_WARNING)
                channel = ctxt->vctxt.warning;
            else
                channel = ctxt->vctxt.error;
            data = ctxt->vctxt.userData;
        } else {
            if (level == XML_ERR_WARNING)
                channel = ctxt->sax->warning;
            else
                channel = ctxt->sax->error;
            data = ctxt->userData;
        }
    }

    if (ctxt->input != NULL) {
        xmlParserInputPtr input = ctxt->input;

        if ((input->filename == NULL) &&
            (ctxt->inputNr > 1)) {
            input = ctxt->inputTab[ctxt->inputNr - 2];
        }
        file = input->filename;
        line = input->line;
        col = input->col;
    }

    res = xmlVRaiseError(schannel, channel, data, ctxt, node, domain, code,
                         level, file, line, (const char *) str1,
                         (const char *) str2, (const char *) str3, int1, col,
                         msg, ap);

    if (res < 0) {
        xmlCtxtErrMemory(ctxt);
        return;
    }

    if (level >= XML_ERR_ERROR)
        ctxt->errNo = code;
    if (level == XML_ERR_FATAL) {
        ctxt->wellFormed = 0;

        if (xmlCtxtIsCatastrophicError(ctxt))
            ctxt->disableSAX = 2; /* stop parser */
        else if (ctxt->recovery == 0)
            ctxt->disableSAX = 1;
    }
}